

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_dec.c
# Opt level: O2

VP8StatusCode
WebPAllocateDecBuffer(int width,int height,WebPDecoderOptions *options,WebPDecBuffer *buffer)

{
  WEBP_CSP_MODE WVar1;
  int iVar2;
  VP8StatusCode VVar3;
  uint8_t *puVar4;
  size_t sVar5;
  uint w;
  ulong uVar6;
  uint uVar7;
  size_t sVar8;
  int scaled_height;
  int scaled_width;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  VVar3 = VP8_STATUS_INVALID_PARAM;
  if (((0 < height) && (0 < width)) && (buffer != (WebPDecBuffer *)0x0)) {
    w = width;
    if (options != (WebPDecoderOptions *)0x0) {
      if (options->use_cropping != 0) {
        w = options->crop_width;
        uVar7 = options->crop_height;
        iVar2 = WebPCheckCropDimensions
                          (width,height,options->crop_left & 0xfffffffe,
                           options->crop_top & 0xfffffffe,w,uVar7);
        height = uVar7;
        if (iVar2 == 0) {
          return VP8_STATUS_INVALID_PARAM;
        }
      }
      if (options->use_scaling != 0) {
        scaled_width = options->scaled_width;
        scaled_height = options->scaled_height;
        iVar2 = WebPRescalerGetScaledDimensions(w,height,&scaled_width,&scaled_height);
        height = scaled_height;
        w = scaled_width;
        if (iVar2 == 0) {
          return VP8_STATUS_INVALID_PARAM;
        }
      }
    }
    buffer->width = w;
    buffer->height = height;
    WVar1 = buffer->colorspace;
    if (WVar1 < MODE_LAST && (0 < height && 0 < (int)w)) {
      if ((buffer->is_external_memory < 1) && (buffer->private_memory == (uint8_t *)0x0)) {
        local_38 = (ulong)WVar1;
        if (0x7fffffff <
            (ulong)"\x03\x04\x03\x04\x04\x02\x02\x04\x04\x04\x02\x01\x01"[local_38] * (ulong)w) {
          return VP8_STATUS_INVALID_PARAM;
        }
        uVar7 = "\x03\x04\x03\x04\x04\x02\x02\x04\x04\x04\x02\x01\x01"[local_38] * w;
        sVar5 = (ulong)uVar7 * (ulong)(uint)height;
        if (WVar1 < MODE_YUV) {
          uVar6 = 0;
          sVar8 = 0;
          local_40 = 0;
          local_48 = 0;
        }
        else {
          local_48 = (ulong)(w + 1 >> 1);
          sVar8 = (height + 1U >> 1) * local_48;
          local_40 = 0;
          uVar6 = (ulong)w * (ulong)(uint)height;
          if (WVar1 != MODE_YUVA) {
            uVar6 = local_40;
          }
          if (local_38 == 0xc) {
            local_40 = (ulong)w;
          }
        }
        puVar4 = (uint8_t *)WebPSafeMalloc(uVar6 + sVar5 + sVar8 * 2,1);
        if (puVar4 == (uint8_t *)0x0) {
          return VP8_STATUS_OUT_OF_MEMORY;
        }
        buffer->private_memory = puVar4;
        (buffer->u).RGBA.rgba = puVar4;
        if ((uint)local_38 < 0xb) {
          (buffer->u).RGBA.stride = uVar7;
          (buffer->u).RGBA.size = sVar5;
        }
        else {
          (buffer->u).YUVA.y_stride = uVar7;
          (buffer->u).YUVA.y_size = sVar5;
          puVar4 = puVar4 + sVar5;
          (buffer->u).YUVA.u = puVar4;
          (buffer->u).YUVA.u_stride = (int)local_48;
          (buffer->u).YUVA.u_size = sVar8;
          (buffer->u).YUVA.v = puVar4 + sVar8;
          (buffer->u).YUVA.v_stride = (int)local_48;
          (buffer->u).YUVA.v_size = sVar8;
          if ((uint)local_38 == 0xc) {
            (buffer->u).YUVA.a = puVar4 + sVar8 * 2;
          }
          (buffer->u).YUVA.a_size = uVar6;
          (buffer->u).YUVA.a_stride = (int)local_40;
        }
      }
      VVar3 = CheckDecBuffer(buffer);
      if (VVar3 == VP8_STATUS_OK && options != (WebPDecoderOptions *)0x0) {
        if (options->flip == 0) {
          VVar3 = VP8_STATUS_OK;
        }
        else {
          VVar3 = WebPFlipBuffer(buffer);
        }
      }
    }
  }
  return VVar3;
}

Assistant:

VP8StatusCode WebPAllocateDecBuffer(int width, int height,
                                    const WebPDecoderOptions* const options,
                                    WebPDecBuffer* const buffer) {
  VP8StatusCode status;
  if (buffer == NULL || width <= 0 || height <= 0) {
    return VP8_STATUS_INVALID_PARAM;
  }
  if (options != NULL) {    // First, apply options if there is any.
    if (options->use_cropping) {
      const int cw = options->crop_width;
      const int ch = options->crop_height;
      const int x = options->crop_left & ~1;
      const int y = options->crop_top & ~1;
      if (!WebPCheckCropDimensions(width, height, x, y, cw, ch)) {
        return VP8_STATUS_INVALID_PARAM;   // out of frame boundary.
      }
      width = cw;
      height = ch;
    }

    if (options->use_scaling) {
#if !defined(WEBP_REDUCE_SIZE)
      int scaled_width = options->scaled_width;
      int scaled_height = options->scaled_height;
      if (!WebPRescalerGetScaledDimensions(
              width, height, &scaled_width, &scaled_height)) {
        return VP8_STATUS_INVALID_PARAM;
      }
      width = scaled_width;
      height = scaled_height;
#else
      return VP8_STATUS_INVALID_PARAM;   // rescaling not supported
#endif
    }
  }
  buffer->width = width;
  buffer->height = height;

  // Then, allocate buffer for real.
  status = AllocateBuffer(buffer);
  if (status != VP8_STATUS_OK) return status;

  // Use the stride trick if vertical flip is needed.
  if (options != NULL && options->flip) {
    status = WebPFlipBuffer(buffer);
  }
  return status;
}